

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O1

FIOBJ fiobj_float_new(double num)

{
  undefined1 *puVar1;
  ulong uVar2;
  undefined8 extraout_XMM0_Qa;
  
  uVar2 = 0x10;
  puVar1 = (undefined1 *)fio_malloc(0x10);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x27;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(double *)(puVar1 + 8) = num;
    return (FIOBJ)puVar1;
  }
  fiobj_float_new_cold_1();
  if (((~(uint)uVar2 & 6) != 0) && (uVar2 != 0)) {
    if (((uVar2 & 1) == 0) && (*(char *)(uVar2 & 0xfffffffffffffff8) == '\'')) {
      *(undefined8 *)((char *)(uVar2 & 0xfffffffffffffff8) + 8) = extraout_XMM0_Qa;
      return (ulong)((uint)uVar2 & 1);
    }
  }
  __assert_fail("FIOBJ_TYPE_IS(obj, FIOBJ_T_FLOAT)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_numbers.c"
                ,0xa3,"void fiobj_float_set(FIOBJ, double)");
}

Assistant:

FIOBJ fiobj_float_new(double num) {
  fiobj_float_s *o = fio_malloc(sizeof(*o));
  if (!o) {
    perror("ERROR: fiobj float couldn't allocate memory");
    exit(errno);
  }
  *o = (fiobj_float_s){
      .head =
          {
              .type = FIOBJ_T_FLOAT,
              .ref = 1,
          },
      .f = num,
  };
  return (FIOBJ)o;
}